

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ExclusiveJoinPromiseNode::~ExclusiveJoinPromiseNode(ExclusiveJoinPromiseNode *this)

{
  AsyncObject *this_00;
  
  Branch::~Branch(&this->right);
  this_00 = (AsyncObject *)&this->left;
  Branch::~Branch((Branch *)this_00);
  AsyncObject::~AsyncObject(this_00);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::~ExclusiveJoinPromiseNode() noexcept(false) {}